

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_BEAM(effect_handler_context_t *context)

{
  wchar_t dam;
  source origin;
  
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,true);
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  project_aimed(origin,context->subtype,context->dir,dam,L'B',context->obj);
  if (player->timed[2] == 0) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_BEAM(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, true);
	int flg = PROJECT_BEAM | PROJECT_KILL;
	(void) project_aimed(context->origin, context->subtype, context->dir, dam,
						 flg, context->obj);
	if (!player->timed[TMD_BLIND])
		context->ident = true;
	return true;
}